

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,short *scaleFactors)

{
  int iVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [64];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  lVar9 = 0;
  local_38 = scaleFactors;
  while (lVar9 < this->kPatternCount) {
    iVar1 = this->kPartialsPaddedStateCount;
    uVar6 = this->kCategoryCount;
    auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
    iVar4 = iVar1 * (int)lVar9;
    for (uVar7 = 0; uVar7 != (~((int)uVar6 >> 0x1f) & uVar6); uVar7 = uVar7 + 1) {
      lVar8 = 0;
      while ((~(this->kStateCount >> 0x1f) & this->kStateCount) != (uint)lVar8) {
        lVar3 = iVar4 + lVar8;
        lVar8 = lVar8 + 1;
        auVar2 = vmaxss_avx(ZEXT416((uint)destP[lVar3]),auVar12._0_16_);
        auVar12 = ZEXT1664(auVar2);
      }
      iVar4 = iVar4 + this->kPaddedPatternCount * iVar1;
    }
    frexp((double)auVar12._0_4_,&local_44);
    local_38[lVar9] = (short)local_44;
    local_40 = lVar9;
    if (local_44 != 0) {
      iVar4 = -local_44;
      for (iVar10 = 0; iVar10 < (int)uVar6; iVar10 = iVar10 + 1) {
        iVar5 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar10 +
                iVar1 * (int)lVar9;
        for (lVar8 = 0; (int)lVar8 < this->kStateCount; lVar8 = lVar8 + 1) {
          dVar11 = ldexp(1.0,iVar4);
          destP[iVar5 + lVar8] = (float)(dVar11 * (double)destP[iVar5 + lVar8]);
        }
        uVar6 = this->kCategoryCount;
      }
    }
    lVar9 = local_40 + 1;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}